

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O3

void __thiscall fizplex::Base::Base(Base *this,ColMatrix *b)

{
  size_t sVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *__x;
  ulong uVar4;
  ETM local_40;
  
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = ColMatrix::row_count(b);
  DVector::DVector(&this->work,sVar1);
  sVar1 = ColMatrix::row_count(b);
  this->m = sVar1;
  uVar4 = -(ulong)(sVar1 >> 0x3d != 0) | sVar1 << 3;
  puVar2 = (unsigned_long *)operator_new__(uVar4);
  memset(puVar2,0,uVar4);
  (this->row_ordering)._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = puVar2;
  sVar1 = ColMatrix::row_count(b);
  sVar3 = ColMatrix::col_count(b);
  if (sVar1 == sVar3) {
    if (this->m != 0) {
      sVar1 = 0;
      do {
        __x = &ColMatrix::column(b,sVar1)->values;
        std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
                  ((vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *)
                   &local_40,__x);
        local_40.col = sVar1;
        std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::
        emplace_back<fizplex::Base::ETM>(&this->etms,&local_40);
        if (local_40.eta.values.
            super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_40.eta.values.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_40.eta.values.
                                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_40.eta.values.
                                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        sVar1 = sVar1 + 1;
      } while (sVar1 < this->m);
      if (this->m != 0) {
        puVar2 = (this->row_ordering)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        uVar4 = 0;
        do {
          puVar2[uVar4] = uVar4;
          uVar4 = uVar4 + 1;
        } while (uVar4 < this->m);
      }
    }
    invert(this);
    return;
  }
  __assert_fail("b.row_count() == b.col_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                ,8,"fizplex::Base::Base(const ColMatrix &)");
}

Assistant:

Base::Base(const ColMatrix &b)
    : work(b.row_count()), m(b.row_count()),
      row_ordering(std::make_unique<size_t[]>(m)) {
  assert(b.row_count() == b.col_count());
  for (size_t i = 0; i < m; i++)
    etms.push_back(ETM(b.column(i), i));
  for (size_t i = 0; i < m; i++)
    row_ordering[i] = i;
  invert();
}